

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O2

void quantize_fp_64x64(__m256i *thr,__m256i *qp,tran_low_t *coeff_ptr,int16_t *iscan_ptr,
                      tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,__m256i *eob)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  auVar5 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar2 = vpabsw_avx2(auVar5);
  auVar4 = vpcmpgtw_avx2(auVar2,(undefined1  [32])*thr);
  if ((((((((((((((((((((((((((((((((auVar4 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   || (auVar4 >> 0xf & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                  (auVar4 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                 || (auVar4 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar4 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar4 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (auVar4 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                            || (auVar4 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar4 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar4 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar4 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar4 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar4 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar4 >> 0x7f,0) != '\0') ||
                    (auVar4 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar4 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar4 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar4 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar4 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar4 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar4 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar4 >> 0xbf,0) != '\0') ||
            (auVar4 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar4 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar4 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar4 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar4 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
       (auVar4 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
      (auVar4 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar4[0x1f] < '\0') {
    auVar2 = vpaddsw_avx2(auVar2,(undefined1  [32])*qp);
    auVar2 = vpand_avx2(auVar4,auVar2);
    auVar4 = vpmulhw_avx2(auVar2,(undefined1  [32])qp[1]);
    auVar2 = vpmullw_avx2(auVar2,(undefined1  [32])qp[1]);
    auVar2 = vpsrlw_avx2(auVar2,0xe);
    auVar4 = vpsllw_avx2(auVar4,2);
    auVar3 = vpor_avx2(auVar4,auVar2);
    auVar2 = vpmulhw_avx2(auVar3,(undefined1  [32])qp[2]);
    auVar4 = vpmullw_avx2(auVar3,(undefined1  [32])qp[2]);
    auVar4 = vpsrlw_avx2(auVar4,2);
    auVar2 = vpsllw_avx2(auVar2,0xe);
    auVar2 = vpor_avx2(auVar2,auVar4);
    auVar4 = vpsignw_avx2(auVar3,auVar5);
    auVar2 = vpsignw_avx2(auVar2,auVar5);
    auVar5 = vpsraw_avx2(auVar4,0xf);
    auVar3 = vpunpcklwd_avx2(auVar4,auVar5);
    auVar5 = vpunpckhwd_avx2(auVar4,auVar5);
    *(undefined1 (*) [32])qcoeff_ptr = auVar3;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar5;
    auVar5 = vpsraw_avx2(auVar2,0xf);
    auVar4 = vpunpcklwd_avx2(auVar2,auVar5);
    auVar5 = vpunpckhwd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar4;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar5;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar3 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar5 = vpcmpeqw_avx2(auVar2,auVar3);
    auVar2 = vpaddw_avx2(auVar4,auVar5);
    auVar4 = vpcmpeqd_avx2(auVar3,auVar3);
    auVar2 = vpsubw_avx2(auVar2,auVar4);
    auVar2 = vpandn_avx2(auVar5,auVar2);
    alVar1 = (__m256i)vpmaxsw_avx2(auVar2,(undefined1  [32])*eob);
    *eob = alVar1;
    return;
  }
  qcoeff_ptr[8] = 0;
  qcoeff_ptr[9] = 0;
  qcoeff_ptr[10] = 0;
  qcoeff_ptr[0xb] = 0;
  qcoeff_ptr[0xc] = 0;
  qcoeff_ptr[0xd] = 0;
  qcoeff_ptr[0xe] = 0;
  qcoeff_ptr[0xf] = 0;
  qcoeff_ptr[0] = 0;
  qcoeff_ptr[1] = 0;
  qcoeff_ptr[2] = 0;
  qcoeff_ptr[3] = 0;
  qcoeff_ptr[4] = 0;
  qcoeff_ptr[5] = 0;
  qcoeff_ptr[6] = 0;
  qcoeff_ptr[7] = 0;
  dqcoeff_ptr[8] = 0;
  dqcoeff_ptr[9] = 0;
  dqcoeff_ptr[10] = 0;
  dqcoeff_ptr[0xb] = 0;
  dqcoeff_ptr[0xc] = 0;
  dqcoeff_ptr[0xd] = 0;
  dqcoeff_ptr[0xe] = 0;
  dqcoeff_ptr[0xf] = 0;
  dqcoeff_ptr[0] = 0;
  dqcoeff_ptr[1] = 0;
  dqcoeff_ptr[2] = 0;
  dqcoeff_ptr[3] = 0;
  dqcoeff_ptr[4] = 0;
  dqcoeff_ptr[5] = 0;
  dqcoeff_ptr[6] = 0;
  dqcoeff_ptr[7] = 0;
  return;
}

Assistant:

static inline void quantize_fp_64x64(const __m256i *thr, const __m256i *qp,
                                     const tran_low_t *coeff_ptr,
                                     const int16_t *iscan_ptr,
                                     tran_low_t *qcoeff_ptr,
                                     tran_low_t *dqcoeff_ptr, __m256i *eob) {
  const __m256i coeff = load_coefficients_avx2(coeff_ptr);
  const __m256i abs_coeff = _mm256_abs_epi16(coeff);
  const __m256i mask = _mm256_cmpgt_epi16(abs_coeff, *thr);
  const int nzflag = _mm256_movemask_epi8(mask);

  if (nzflag) {
    const __m256i tmp_rnd =
        _mm256_and_si256(_mm256_adds_epi16(abs_coeff, qp[0]), mask);
    const __m256i qh = _mm256_slli_epi16(_mm256_mulhi_epi16(tmp_rnd, qp[1]), 2);
    const __m256i ql =
        _mm256_srli_epi16(_mm256_mullo_epi16(tmp_rnd, qp[1]), 14);
    const __m256i abs_q = _mm256_or_si256(qh, ql);
    const __m256i dqh = _mm256_slli_epi16(_mm256_mulhi_epi16(abs_q, qp[2]), 14);
    const __m256i dql = _mm256_srli_epi16(_mm256_mullo_epi16(abs_q, qp[2]), 2);
    const __m256i abs_dq = _mm256_or_si256(dqh, dql);
    const __m256i q = _mm256_sign_epi16(abs_q, coeff);
    const __m256i dq = _mm256_sign_epi16(abs_dq, coeff);
    // Check the signed q/dq value here instead of the absolute value. When
    // dequant equals 4, the dequant threshold (*thr) becomes 0 after being
    // scaled down by (1 + log_scale). See init_qp(). When *thr is 0 and the
    // abs_coeff is 0, the nzflag will be set. As a result, the eob will be
    // incorrectly calculated. The psign instruction corrects the error by
    // zeroing out q/dq if coeff is zero.
    const __m256i z_mask = _mm256_cmpeq_epi16(dq, _mm256_setzero_si256());
    const __m256i nz_mask = _mm256_cmpeq_epi16(z_mask, _mm256_setzero_si256());

    store_coefficients_avx2(q, qcoeff_ptr);
    store_coefficients_avx2(dq, dqcoeff_ptr);

    *eob = get_max_lane_eob(iscan_ptr, *eob, nz_mask);
  } else {
    write_zero(qcoeff_ptr);
    write_zero(dqcoeff_ptr);
  }
}